

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

void __thiscall
TS_program_map_section::extractPMTDescriptors
          (TS_program_map_section *this,uint8_t *curPos,int es_info_len)

{
  byte bVar1;
  uint8_t len;
  TSDescriptorTag tag;
  uint8_t *end;
  byte *pbStack_18;
  int es_info_len_local;
  uint8_t *curPos_local;
  TS_program_map_section *this_local;
  
  for (pbStack_18 = curPos; pbStack_18 < curPos + es_info_len;
      pbStack_18 = pbStack_18 + 2 + (int)(uint)bVar1) {
    bVar1 = pbStack_18[1];
    if ((*pbStack_18 == 9) && (3 < bVar1)) {
      this->casID = (uint)pbStack_18[2] * 0x100 + (uint)pbStack_18[3];
      this->casPID = (pbStack_18[4] & 0xf) * 0x100 + (uint)pbStack_18[5];
    }
  }
  return;
}

Assistant:

void TS_program_map_section::extractPMTDescriptors(uint8_t* curPos, const int es_info_len)
{
    const uint8_t* end = curPos + es_info_len;
    while (curPos < end)
    {
        const auto tag = static_cast<TSDescriptorTag>(*curPos);
        const uint8_t len = curPos[1];
        curPos += 2;
        if (tag == TSDescriptorTag::CAS && len >= 4)
        {
            casID = (curPos[0] << 8) + curPos[1];
            casPID = ((curPos[2] & 0x0f) << 8) + curPos[3];
        }
        curPos += len;
    }
}